

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O2

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
::construct_msgs(suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                 *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_1,
                vector<unsigned_long,_std::allocator<unsigned_long>_> *param_2,int dist)

{
  comm *comm;
  unsigned_long uVar1;
  ulong uVar2;
  pointer puVar3;
  anon_class_64_8_0d7252e9 f;
  pointer pTVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  bool cond;
  ulong uVar9;
  ostream *poVar10;
  long lVar11;
  pointer pmVar12;
  pointer pmVar13;
  int iVar14;
  pointer puVar15;
  unsigned_long uVar16;
  ulong uVar17;
  pointer pTVar18;
  size_t prefix;
  int overlap_type;
  uint local_22c;
  _Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> local_228;
  int my_schedule;
  vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> msgs;
  unsigned_long local_1e8;
  int left_p;
  ulong local_1d0;
  TwoBSA<unsigned_long> tuple;
  _Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> local_1a8;
  unsigned_long local_188;
  pointer local_180;
  size_t rebucket_offset;
  size_t unresolved_els;
  vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> out_of_bounds_msgs;
  vector<int,_std::allocator<int>_> schedule;
  _Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> active_elements;
  pointer local_f0;
  size_t unfinished_b;
  block_decomposition_buffered<unsigned_long> *local_e0;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  minqueries;
  section_timer timer;
  
  comm = &this->comm;
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  section_timer_impl(&timer,(ostream *)&std::cerr,(this->comm).mpi_comm,0);
  local_1e8 = mxx::left_shift<unsigned_long>
                        ((param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_start,comm);
  local_e0 = &this->part;
  prefix = (this->part).prefix;
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar9 = 0;
  while (tuple.B1 = uVar9,
        puVar15 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start,
        tuple.B1 <
        (ulong)((long)(param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar15 >> 3)) {
    uVar1 = puVar15[tuple.B1];
    uVar9 = tuple.B1 + 1;
    if (((uVar1 != prefix + uVar9) ||
        ((uVar17 = this->local_size - 1, tuple.B1 < uVar17 && (puVar15[tuple.B1 + 1] == uVar1)))) ||
       ((tuple.B1 == uVar17 && ((local_1e8 == uVar1 && ((this->comm).m_rank < this->p + -1)))))) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&active_elements,&tuple.B1);
      uVar9 = tuple.B1 + 1;
    }
  }
  std::__cxx11::string::string((string *)&tuple,"get active elements",(allocator *)&msgs);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            (&timer,(string *)&tuple);
  std::__cxx11::string::~string((string *)&tuple);
  if ((this->comm).m_rank < this->p + -1) {
    puVar15 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    local_22c = (uint)CONCAT71((int7)((ulong)puVar15 >> 8),puVar15[-1] == local_1e8);
  }
  else {
    local_22c = 0;
  }
  uVar9 = (ulong)dist;
  do {
    if (this->n <= uVar9) break;
    msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    out_of_bounds_msgs.
    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    unresolved_els = 0;
    unfinished_b = 0;
    msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    out_of_bounds_msgs.
    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    out_of_bounds_msgs.
    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_180 = active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    local_1d0 = uVar9;
    for (puVar15 = active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar15 != local_180;
        puVar15 = puVar15 + 1) {
      uVar1 = *puVar15;
      uVar16 = prefix + uVar1;
      tuple.B1 = (this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar1] + local_1d0;
      tuple.B2 = uVar16;
      if (tuple.B1 < this->n) {
        std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
        emplace_back<mypair<unsigned_long>>
                  ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)&msgs,
                   (mypair<unsigned_long> *)&tuple);
      }
      else {
        tuple.B1 = 0;
        std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
        emplace_back<mypair<unsigned_long>>
                  ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)
                   &out_of_bounds_msgs,(mypair<unsigned_long> *)&tuple);
      }
      unresolved_els = unresolved_els + 1;
      if ((param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar1] == uVar16 + 1) {
        unfinished_b = unfinished_b + 1;
      }
    }
    local_188 = mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(&unresolved_els,comm);
    mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(&unfinished_b,comm);
    if ((this->comm).m_rank == 0) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"==== chaising iteration ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      poVar10 = std::operator<<(poVar10," unresolved = ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::endl<char,std::char_traits<char>>(poVar10);
      poVar10 = std::operator<<((ostream *)&std::cerr,"==== chaising iteration ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      poVar10 = std::operator<<(poVar10," unfinished = ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    if (local_188 != 0) {
      mxx::
      all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_1_>
                (&msgs,(anon_class_8_1_8991fb9c)this,comm);
      puVar15 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      for (pmVar13 = msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pmVar13 !=
          msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
          _M_impl.super__Vector_impl_data._M_finish; pmVar13 = pmVar13 + 1) {
        pmVar13->first = puVar15[pmVar13->first - prefix];
      }
      mxx::
      all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_2_>
                (&msgs,(anon_class_8_1_8991fb9c)this,comm);
      if (out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_start) {
        std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
        insert<__gnu_cxx::__normal_iterator<mypair<unsigned_long>*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>,void>
                  ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)&msgs,
                   (const_iterator)
                   msgs.
                   super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                    )out_of_bounds_msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                    )out_of_bounds_msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_start) {
        out_of_bounds_msgs.
        super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             out_of_bounds_msgs.
             super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if ((long)msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4 != unresolved_els) {
        __assert_fail("msgs.size() == unresolved_els",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x5be,
                      "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                     );
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<mypair<unsigned_long>*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&,mypair<unsigned_long>const&)_1_>>
                ();
      local_228._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_228._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      minqueries.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      minqueries.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      minqueries.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      overlap_type = 0;
      local_180 = (pointer)(*(param_1->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start - 1);
      local_f0 = (pointer)0x0;
      pmVar13 = msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while (pmVar13 !=
             msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        uVar17 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[pmVar13->second - prefix];
        uVar9 = uVar17 - 1;
        if (prefix <= uVar9 && uVar9 != pmVar13->second) {
          __assert_fail("bucket_begin < prefix || bucket_begin == msgit->second",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                        ,0x5dc,
                        "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                       );
        }
        for (; pTVar8 = local_138._M_impl.super__Vector_impl_data._M_end_of_storage,
            pTVar7 = local_138._M_impl.super__Vector_impl_data._M_finish,
            pTVar6 = local_138._M_impl.super__Vector_impl_data._M_start,
            pTVar5 = local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage,
            pTVar4 = local_1a8._M_impl.super__Vector_impl_data._M_finish,
            pTVar18 = local_1a8._M_impl.super__Vector_impl_data._M_start,
            pmVar13 !=
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish; pmVar13 = pmVar13 + 1) {
          uVar2 = pmVar13->second;
          lVar11 = uVar2 - prefix;
          puVar15 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (puVar15[lVar11] != uVar17) goto LAB_00125cab;
          if ((uVar2 < prefix) || (prefix + this->local_size <= uVar2)) {
            __assert_fail("msgit->second >= prefix && msgit->second < prefix+local_size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                          ,0x5e1,
                          "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                         );
          }
          tuple.SA = (this->local_SA).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11];
          tuple.B1 = puVar15[lVar11];
          tuple.B2 = pmVar13->first;
          std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::push_back
                    ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                     &local_228,(value_type *)&tuple);
        }
        if ((local_22c & 1) == 0) {
LAB_00125cab:
          if (uVar9 < prefix) {
            overlap_type = overlap_type + 1;
            local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_228._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1a8._M_impl.super__Vector_impl_data._M_start =
                 local_228._M_impl.super__Vector_impl_data._M_start;
            local_1a8._M_impl.super__Vector_impl_data._M_finish =
                 local_228._M_impl.super__Vector_impl_data._M_finish;
            local_228._M_impl.super__Vector_impl_data._M_start = pTVar18;
            local_228._M_impl.super__Vector_impl_data._M_finish = pTVar4;
            local_228._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar5;
          }
          else {
            std::
            __sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_228._M_impl.super__Vector_impl_data._M_start,
                       local_228._M_impl.super__Vector_impl_data._M_finish);
            puVar15 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            if ((uVar9 - prefix != 0) && (uVar17 <= puVar15[(uVar9 - prefix) + -1])) {
              __assert_fail("out_idx == 0 || local_B[out_idx-1] < cur_b",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                            ,0x603,
                            "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                           );
            }
            puVar3 = (this->local_SA).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar11 = uVar17 - prefix;
            for (pTVar18 = local_228._M_impl.super__Vector_impl_data._M_start;
                pTVar18 != local_228._M_impl.super__Vector_impl_data._M_finish;
                pTVar18 = pTVar18 + 1) {
              if ((pTVar18 != local_228._M_impl.super__Vector_impl_data._M_start) &&
                 (pTVar18[-1].B2 != pTVar18->B2)) {
                uVar17 = prefix + lVar11;
              }
              puVar3[lVar11 + -1] = pTVar18->SA;
              puVar15[lVar11 + -1] = uVar17;
              lVar11 = lVar11 + 1;
            }
            if ((this->local_size + 1 != lVar11) && (puVar15[lVar11 + -1] - prefix != lVar11)) {
              __assert_fail("out_idx == local_size || local_B[out_idx] == prefix+out_idx+1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                            ,0x620,
                            "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                           );
            }
          }
        }
        else {
          if ((this->p + -1 <= (this->comm).m_rank) ||
             ((param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1] != local_1e8)) {
            __assert_fail("comm.rank() < p-1 && local_B.back() == right_B",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                          ,0x5eb,
                          "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                         );
          }
          if (uVar9 < prefix) {
            local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_228._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1a8._M_impl.super__Vector_impl_data._M_start =
                 local_228._M_impl.super__Vector_impl_data._M_start;
            local_1a8._M_impl.super__Vector_impl_data._M_finish =
                 local_228._M_impl.super__Vector_impl_data._M_finish;
            local_228._M_impl.super__Vector_impl_data._M_start = pTVar18;
            local_228._M_impl.super__Vector_impl_data._M_finish = pTVar4;
            local_228._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar5;
            overlap_type = 4;
          }
          else {
            overlap_type = overlap_type + 2;
            local_138._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_228._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_138._M_impl.super__Vector_impl_data._M_start =
                 local_228._M_impl.super__Vector_impl_data._M_start;
            local_138._M_impl.super__Vector_impl_data._M_finish =
                 local_228._M_impl.super__Vector_impl_data._M_finish;
            local_228._M_impl.super__Vector_impl_data._M_start = pTVar6;
            local_228._M_impl.super__Vector_impl_data._M_finish = pTVar7;
            local_228._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar8;
            local_f0 = (pointer)(uVar9 - prefix);
          }
        }
        if (local_228._M_impl.super__Vector_impl_data._M_finish !=
            local_228._M_impl.super__Vector_impl_data._M_start) {
          local_228._M_impl.super__Vector_impl_data._M_finish =
               local_228._M_impl.super__Vector_impl_data._M_start;
        }
      }
      my_schedule = -1;
      if ((this->comm).m_rank == 0) {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&tuple,(long)this->p,
                   (allocator_type *)&schedule);
        MPI_Gather(&overlap_type,1,&ompi_mpi_int,tuple.B1,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
        std::vector<int,_std::allocator<int>_>::vector
                  (&schedule,(long)this->p,(allocator_type *)&rebucket_offset);
        iVar14 = 0;
        for (lVar11 = 0; lVar11 < this->p; lVar11 = lVar11 + 1) {
          switch(*(undefined4 *)(tuple.B1 + lVar11 * 4)) {
          case 0:
            schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar11] = -1;
            break;
          case 1:
          case 4:
            schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar11] = iVar14;
            break;
          case 2:
            schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar11] = 0;
            iVar14 = 0;
            break;
          case 3:
            schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar11] = iVar14;
            iVar14 = 1 - iVar14;
            break;
          default:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                          ,0x64d,
                          "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                         );
          }
        }
        MPI_Scatter(schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,1,&ompi_mpi_int,&my_schedule,1,&ompi_mpi_int,0,
                    (this->comm).mpi_comm);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&schedule.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&tuple);
      }
      else {
        MPI_Gather(&overlap_type,1,&ompi_mpi_int,0,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
        MPI_Scatter(0,1,&ompi_mpi_int,&my_schedule,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
      }
      for (iVar14 = 0; iVar14 != 2; iVar14 = iVar14 + 1) {
        std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
                  ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)&tuple,
                   (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                   &local_1a8);
        puVar15 = local_180;
        left_p = mxx::partition::block_decomposition_buffered<unsigned_long>::target_processor
                           (local_e0,(unsigned_long)local_180);
        schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        rebucket_offset = (size_t)puVar15;
        if (iVar14 == my_schedule || overlap_type != 3) {
          if (overlap_type == 2 && iVar14 == my_schedule) goto LAB_00125fa1;
          cond = overlap_type != 0 && iVar14 == my_schedule;
        }
        else {
LAB_00125fa1:
          std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator=
                    ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                     &tuple,(vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)&local_138);
          left_p = (this->comm).m_rank;
          schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = local_f0;
          rebucket_offset = prefix + (long)local_f0;
          cond = true;
        }
        f.border_bucket =
             (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)&tuple;
        f.left_p = &left_p;
        f.this = this;
        f.rebucket_offset = &rebucket_offset;
        f.minqueries = &minqueries;
        f.bucket_offset = (size_t *)&schedule;
        f.local_B = param_1;
        f.prefix = &prefix;
        mxx::comm::
        with_subset<suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mxx::comm_const&)_1_>
                  (comm,cond,f);
        mxx::comm::barrier(comm);
        std::_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
        ~_Vector_base((_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                       *)&tuple);
      }
      local_1e8 = mxx::left_shift<unsigned_long>
                            ((param_1->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start,comm);
      if ((this->comm).m_rank < this->p + -1) {
        puVar15 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        local_22c = (uint)CONCAT71((int7)((ulong)puVar15 >> 8),puVar15[-1] == local_1e8);
      }
      else {
        local_22c = 0;
      }
      pmVar13 = msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      for (; pmVar13 !=
             msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; pmVar13 = pmVar13 + 1) {
        tuple.B1 = pmVar13->second - prefix;
        puVar15 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar1 = puVar15[tuple.B1];
        if (((uVar1 != pmVar13->second + 1) ||
            ((uVar9 = this->local_size - 1, tuple.B1 < uVar9 && (puVar15[tuple.B1 + 1] == uVar1))))
           || ((tuple.B1 == uVar9 && ((local_1e8 == uVar1 && ((this->comm).m_rank < this->p + -1))))
              )) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&active_elements,(value_type_conflict1 *)&tuple);
        }
      }
      puVar15 = (this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (pmVar12 = msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pmVar12 != pmVar13;
          pmVar12 = pmVar12 + 1) {
        pmVar12->first = puVar15[pmVar12->second - prefix];
        pmVar12->second = puVar3[pmVar12->second - prefix];
      }
      mxx::
      all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_3_>
                (&msgs,(anon_class_8_1_8991fb9c)this,comm);
      puVar15 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      for (pmVar13 = msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pmVar13 !=
          msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
          _M_impl.super__Vector_impl_data._M_finish; pmVar13 = pmVar13 + 1) {
        puVar15[pmVar13->first - prefix] = pmVar13->second;
      }
      std::__cxx11::string::string
                ((string *)&tuple,"bucket-chaising iteration",(allocator *)&schedule);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                (&timer,(string *)&tuple);
      std::__cxx11::string::~string((string *)&tuple);
      std::
      _Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ::~_Vector_base(&minqueries.
                       super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                     );
      std::_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
      ~_Vector_base(&local_138);
      std::_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
      ~_Vector_base(&local_1a8);
      std::_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
      ~_Vector_base(&local_228);
    }
    std::_Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::~_Vector_base
              (&out_of_bounds_msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>);
    std::_Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::~_Vector_base
              (&msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>);
    uVar9 = local_1d0 * 2;
  } while (local_188 != 0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  ~section_timer_impl(&timer);
  return;
}

Assistant:

void construct_msgs(std::vector<index_t>& local_B, std::vector<index_t>& local_ISA, int dist)
{
    /*
     * Algorithm for few remaining buckets (more communication overhead per
     * element but sends only unfinished buckets -> less data in total if few
     * buckets remaining)
     *
     * INPUT:
     *  - SA in SA order
     *  - B in SA order
     *  - ISA in ISA order (<=> B in ISA order)
     *  - dist: the current dist=2^k, gets doubled after every iteration
     *
     * ALGO:
     * 1.) on i:            send tuple (`to:` Sa[i]+2^k, `from:` i)
     * 2.) on SA[i]+2^k:    return tuple (`to:` i, ISA[SA[i]+2^k])
     * 3.) on i:            for each unfinished bucket:
     *                          sort by new bucket index (2-stage across
     *                          processor boundaries using MPI subcommunicators)
     *                          rebucket into `B`
     * 4.) on i:            send tuple (`to:` SA[i], B[i]) // update bucket numbers in ISA order
     * 5.) on SA[i]:        update ISA[SA[i]] to new B[i]
     *
     */

    SAC_TIMER_START();


    /*
     * 0.) Preparation: need unfinished buckets (info accross proc. boundaries)
     */
    // get next element from right
    index_t right_B = mxx::left_shift(local_B[0], comm);

    // get global offset
    const std::size_t prefix = part.excl_prefix_size();

    // get active elements
    std::vector<index_t> active_elements;
    for (std::size_t j = 0; j < local_B.size(); ++j) {
        // get global index for each local index
        std::size_t i =  prefix + j;
        // check if this is a unresolved bucket
        // relying on the property that for resolved buckets:
        //   B[i] == i+1 and B[i+1] == i+2
        //   (where `i' is the global index)
        if (local_B[j] != i+1 || (local_B[j] == i+1
                    && ((j < local_size-1 && local_B[j+1] == i+1)
                        || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
        {
            // save local active indexes
            active_elements.push_back(j);
        }
    }
    SAC_TIMER_END_SECTION("get active elements");

    bool right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

    for (index_t shift_by = dist; shift_by < n; shift_by <<= 1) {
        /*
         * 1.) on i: send tuple (`to:` Sa[i]+2^k, `from:` i)
         */
        //std::vector<std::pair<index_t, index_t> > msgs;
        //std::vector<std::pair<index_t, index_t> > out_of_bounds_msgs;
        std::vector<mypair<index_t> > msgs;
        std::vector<mypair<index_t> > out_of_bounds_msgs;
        // linear scan for bucket boundaries
        // and create tuples/pairs
        std::size_t unresolved_els = 0;
        std::size_t unfinished_b = 0;
        for (index_t j : active_elements) {
            // get global index for each local index
            std::size_t i =  prefix + j;
            // add tuple
            if (local_SA[j] + shift_by >= n)
                //out_of_bounds_msgs.push_back(std::make_pair<index_t,index_t>(0, static_cast<index_t>(i)));
                out_of_bounds_msgs.push_back({0, static_cast<index_t>(i)});
            else
                //msgs.push_back(std::make_pair<index_t,index_t>(local_SA[j]+shift_by, static_cast<index_t>(i)));
                msgs.push_back({local_SA[j]+shift_by, static_cast<index_t>(i)});
            unresolved_els++;
            if (local_B[j] == i+1) // if first element of unfinished bucket:
                unfinished_b++;
        }

        // check if all resolved
        std::size_t gl_unresolved = mxx::allreduce(unresolved_els, comm);
        std::size_t gl_unfinished = mxx::allreduce(unfinished_b, comm);
        if (comm.rank() == 0) {
            INFO("==== chaising iteration " << shift_by << " unresolved = " << gl_unresolved);
            INFO("==== chaising iteration " << shift_by << " unfinished = " << gl_unfinished);
        }
        if (gl_unresolved == 0)
            // finished!
            break;

        // message exchange to processor which contains first index
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.first);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // for each message, add the bucket no. into the `first` field
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_ISA[it->first - prefix];
        }


        /*
         * 2.)
         */
        // send messages back to originator
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.second);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.second);}, comm);

        // append the previous out-of-bounds messages (since they all have B2 = 0)
        if (out_of_bounds_msgs.size() > 0)
            msgs.insert(msgs.end(), out_of_bounds_msgs.begin(), out_of_bounds_msgs.end());
        out_of_bounds_msgs.clear();

        assert(msgs.size() == unresolved_els);

        // sort received messages by the target index to enable consecutive
        // scanning of local buckets and messages
        std::sort(msgs.begin(), msgs.end(), [](const mypair<index_t>& x, const mypair<index_t>& y){ return x.second < y.second;});

        /*
         * 3.)
         */
        // building sequence of triplets for each unfinished bucket and sort
        // then rebucket, buckets which spread accross boundaries, sort via
        // MPI sub communicators and samplesort in two phases
        std::vector<TwoBSA<index_t> > bucket;
        std::vector<TwoBSA<index_t> > left_bucket;
        std::vector<TwoBSA<index_t> > right_bucket;

        // prepare LCP queries vector
        std::vector<std::tuple<index_t, index_t, index_t> > minqueries;

        // find bucket boundaries:
        auto msgit = msgs.begin();
        // overlap type:    0: no overlaps, 1: left overlap, 2:right overlap,
        //                  3: separate overlaps on left and right
        //                  4: contiguous overlap with both sides
        int overlap_type = 0; // init to no overlaps
        std::size_t bucket_begin = local_B[0]-1;
        std::size_t first_bucket_begin = bucket_begin;
        std::size_t right_bucket_offset = 0;
        while (msgit != msgs.end()) {
            bucket_begin = local_B[msgit->second - prefix]-1;
            assert(bucket_begin < prefix || bucket_begin == msgit->second);

            // find end of bucket
            while (msgit != msgs.end() && local_B[msgit->second - prefix]-1 == bucket_begin) {
                TwoBSA<index_t> tuple;
                assert(msgit->second >= prefix && msgit->second < prefix+local_size);
                tuple.SA = local_SA[msgit->second - prefix];
                tuple.B1 = local_B[msgit->second - prefix];
                tuple.B2 = msgit->first;
                bucket.push_back(tuple);
                msgit++;
            }

            // get bucket end (could be on other processor)
            if (msgit == msgs.end() && right_bucket_crosses_proc) {
                assert(comm.rank() < p-1 && local_B.back() == right_B);
                if (bucket_begin >= prefix)
                {
                    overlap_type += 2;
                    right_bucket.swap(bucket);
                    right_bucket_offset = bucket_begin - prefix;
                }
                else
                {
                    // bucket extends to left AND right
                    left_bucket.swap(bucket);
                    overlap_type = 4;
                }
            } else {
                if (bucket_begin >= prefix)
                {
                    // this is a local bucket => sort by B2, rebucket, and save
                    // TODO custom comparison that only sorts by B2, not by B1 as well
                    std::sort(bucket.begin(), bucket.end());
                    // local rebucket
                    // save back into local_B, local_SA, etc
                    index_t cur_b = bucket_begin + 1;
                    std::size_t out_idx = bucket_begin - prefix;
                    // assert previous bucket index is smaller
                    assert(out_idx == 0 || local_B[out_idx-1] < cur_b);
                    for (auto it = bucket.begin(); it != bucket.end(); ++it)
                    {
                        // if this is a new bucket, then update number
                        if (it != bucket.begin() && (it-1)->B2 != it->B2)
                        {
                            // update bucket index
                            cur_b = out_idx + prefix + 1;

                            if (_CONSTRUCT_LCP)
                            {
                                // add as query item for LCP construction
                                index_t left_b  = std::min((it-1)->B2, it->B2);
                                index_t right_b = std::max((it-1)->B2, it->B2);
                                // we need the minumum LCP of all suffixes in buckets between
                                // these two buckets. Since the first element in the left bucket
                                // is the LCP of this bucket with its left bucket and we don't need
                                // this LCP value, start one to the right:
                                // (-1 each since buffer numbers are current index + 1)
                                index_t range_left = (left_b-1) + 1;
                                index_t range_right = (right_b-1) + 1; // +1 since exclusive index
                                minqueries.emplace_back(out_idx + prefix, range_left, range_right);
                            }
                        }
                        local_SA[out_idx] = it->SA;
                        local_B[out_idx] = cur_b;
                        out_idx++;
                    }
                    // assert next bucket index is larger
                    assert(out_idx == local_size || local_B[out_idx] == prefix+out_idx+1);
                }
                else
                {
                    overlap_type += 1;
                    left_bucket.swap(bucket);
                }
            }
            bucket.clear();
        }

        // if we have left/right/both/or double buckets, do global comm in two phases
        int my_schedule = -1;
        if (comm.rank() == 0) {
            // gather all types to first processor
            std::vector<int> overlaps(p);
            MPI_Gather(&overlap_type, 1, MPI_INT, &overlaps[0], 1, MPI_INT, 0, comm);

            // create schedule using linear scan over the overlap types
            std::vector<int> schedule(p);
            int phase = 0; // start in first phase
            for (int i = 0; i < p; ++i) {
                switch (overlaps[i]) {
                    case 0:
                        schedule[i] = -1; // doesn't matter
                        break;
                    case 1:
                        // only left overlap -> participate in current phase
                        schedule[i] = phase;
                        break;
                    case 2:
                        // only right overlap, start with phase 0
                        phase = 0;
                        schedule[i] = phase;
                        break;
                    case 3:
                        // separate overlaps left and right -> switch phase
                        schedule[i] = phase; // left overlap starts with current phase
                        phase = 1 - phase;
                        break;
                    case 4:
                        // overlap with both: left and right => keep phase
                        schedule[i] = phase;
                        break;
                    default:
                        assert(false);
                        break;
                }
            }

            // scatter the schedule to the processors
            MPI_Scatter(&schedule[0], 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        } else {
            // send out my overlap type
            MPI_Gather(&overlap_type, 1, MPI_INT, NULL, 1, MPI_INT, 0, comm);

            // ... let master processor solve the schedule

            // receive schedule:
            MPI_Scatter(NULL, 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        }


        // two phase sorting across boundaries using sub communicators
        for (int phase = 0; phase <= 1; ++phase) {
            std::vector<TwoBSA<index_t> > border_bucket = left_bucket;
            // the leftmost processor of a group will be used as split
            int left_p = part.target_processor(first_bucket_begin);
            bool participate = (overlap_type != 0 && my_schedule == phase);
            std::size_t bucket_offset = 0; // left bucket starts from beginning
            std::size_t rebucket_offset = first_bucket_begin;
            if ((my_schedule != phase && overlap_type == 3) || (my_schedule == phase && overlap_type == 2)) {
                // starting a bucket at the end
                border_bucket = right_bucket;
                left_p = comm.rank();
                participate = true;
                bucket_offset = right_bucket_offset;
                rebucket_offset = prefix + bucket_offset;
            }

            comm.with_subset(participate,[&](const mxx::comm& sc) {
                // split communicator to `left_p`
                mxx::comm subcomm = sc.split(left_p);

                // sample sort the bucket with arbitrary distribution
                mxx::sort(border_bucket.begin(), border_bucket.end(), subcomm);

#ifndef NDEBUG
                index_t first_bucket = border_bucket[0].B1;
#endif
                // rebucket with global offset of first -> in tuple form (also updates LCP)
                rebucket_tuples(border_bucket, subcomm, rebucket_offset, minqueries);
                // assert first bucket index remains the same
                assert(subcomm.rank() != 0 || first_bucket == border_bucket[0].B1);

                // save into full array (if this was left -> save to beginning)
                // (else, need offset of last)
                assert(bucket_offset == 0 || local_B[bucket_offset-1] < border_bucket[0].B1);
                assert(bucket_offset+border_bucket.size() <= local_size);
                for (std::size_t i = 0; i < border_bucket.size(); ++i) {
                    local_SA[i+bucket_offset] = border_bucket[i].SA;
                    local_B[i+bucket_offset] = border_bucket[i].B1;
                }
                assert(bucket_offset+border_bucket.size() == local_size || (local_B[bucket_offset+border_bucket.size()] > local_B[bucket_offset+border_bucket.size()-1]));
                assert(subcomm.rank() != 0 || local_B[bucket_offset] == bucket_offset+prefix+1);

                /*
                 * LCP update
                 */
                // LCP is updated in the custom `rebucket_tuples` function
            });

            comm.barrier();
        }


        // get new bucket number to the right
        right_B = mxx::left_shift(local_B[0], comm);
        // check if right bucket still goes over boundary
        right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

        // remember all the remaining active elements
        active_elements.clear();
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            index_t j = it->second - prefix;
            index_t i = it->second;
            // check if this is a unresolved bucket
            // relying on the property that for resolved buckets:
            //   B[i] == i+1 and B[i+1] == i+2
            //   (where `i' is the global index)
            if (local_B[j] != i+1 || (local_B[j] == i+1
                        && ((j < local_size-1 && local_B[j+1] == i+1)
                            || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
            {
                // save local active indexes
                active_elements.push_back(j);
            }
        }

        /*
         * 4.1)   Update LCP
         */
        if (_CONSTRUCT_LCP) {
            // time LCP separately!
            SAC_TIMER_START();
            // get parallel-distributed RMQ for all queries, results are in
            // `minqueries`
            // TODO: bulk updatable RMQs [such that we don't have to construct the
            //       RMQ for the local_LCP in each iteration]
            bulk_rmq(n, local_LCP, minqueries, comm);

            // update the new LCP values:
            for (auto min_lcp : minqueries) {
                local_LCP[std::get<0>(min_lcp) - prefix] = shift_by + std::get<2>(min_lcp);
            }
            SAC_TIMER_END_SECTION("LCP update");
        }

        /*
         * 4.2)  Update ISA
         */
        // message new bucket numbers to new SA[i] for all previously unfinished
        // buckets
        // since the message array is still available with the indices of unfinished
        // buckets -> reuse that information => no need to rescan the whole
        // local array
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_SA[it->second - prefix]; // SA[i]
            it->second = local_B[it->second - prefix]; // B[i]
        }

        // message exchange to processor which contains first index
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // update local ISA with new bucket numbers
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            local_ISA[it->first-prefix] = it->second;
        }
        SAC_TIMER_END_SECTION("bucket-chaising iteration");
    }
}